

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O2

void __thiscall AmstradCPC::ConcreteMachine<true>::flush_output(ConcreteMachine<true> *this)

{
  int in_ESI;
  
  flush_output((ConcreteMachine<true> *)(this[-1].ram_ + 0x1fff7),in_ESI);
  return;
}

Assistant:

void flush_output(int outputs) final {
			// Just flush the AY.
			if(outputs & Output::Audio) {
				ay_.update();
				ay_.flush();
			}

			// Always flush the FDC.
			flush_fdc();
		}